

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

UBool ucnv_extInitialMatchToU_63
                (UConverter *cnv,int32_t *cx,int32_t firstLength,char **src,char *srcLimit,
                UChar **target,UChar *targetLimit,int32_t **offsets,int32_t srcIndex,UBool flush,
                UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  char cVar2;
  int32_t iVar3;
  ulong uVar4;
  char *pcVar5;
  int8_t sisoState;
  ulong uVar6;
  UBool in_stack_ffffffffffffffb8;
  uint32_t value;
  UChar **local_38;
  
  value = 0;
  uVar1 = (cnv->sharedData->mbcs).outputType;
  if (uVar1 == '\f') {
    sisoState = (int8_t)cnv->mode;
  }
  else {
    sisoState = (uVar1 == 0xdb) * '\x02' + -1;
  }
  pcVar5 = *src;
  local_38 = target;
  iVar3 = ucnv_extMatchToU(cx,sisoState,(char *)cnv->toUBytes,firstLength,pcVar5,
                           (int)srcLimit - (int)pcVar5,&value,flush,in_stack_ffffffffffffffb8);
  if (iVar3 < 1) {
    uVar4 = 0;
    if (-1 < iVar3) goto LAB_001afe76;
    cnv->preToUFirstLength = (int8_t)firstLength;
    uVar6 = (ulong)(uint)firstLength;
    if (firstLength < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      cnv->preToU[uVar4] = cnv->toUBytes[uVar4];
    }
    pcVar5 = *src;
    for (; uVar6 < (uint)-iVar3; uVar6 = uVar6 + 1) {
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
      cnv->preToU[uVar6] = cVar2;
    }
    *src = pcVar5;
    cnv->preToULength = (int8_t)-iVar3;
  }
  else {
    *src = pcVar5 + (iVar3 - firstLength);
    ucnv_extWriteToU(cnv,cx,value,local_38,targetLimit,offsets,srcIndex,pErrorCode);
  }
  uVar4 = 1;
LAB_001afe76:
  return (UBool)uVar4;
}

Assistant:

U_CFUNC UBool
ucnv_extInitialMatchToU(UConverter *cnv, const int32_t *cx,
                        int32_t firstLength,
                        const char **src, const char *srcLimit,
                        UChar **target, const UChar *targetLimit,
                        int32_t **offsets, int32_t srcIndex,
                        UBool flush,
                        UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    /* try to match */
    match=ucnv_extMatchToU(cx, (int8_t)UCNV_SISO_STATE(cnv),
                           (const char *)cnv->toUBytes, firstLength,
                           *src, (int32_t)(srcLimit-*src),
                           &value,
                           cnv->useFallback, flush);
    if(match>0) {
        /* advance src pointer for the consumed input */
        *src+=match-firstLength;

        /* write result to target */
        ucnv_extWriteToU(cnv, cx,
                         value,
                         target, targetLimit,
                         offsets, srcIndex,
                         pErrorCode);
        return TRUE;
    } else if(match<0) {
        /* save state for partial match */
        const char *s;
        int32_t j;

        /* copy the first code point */
        s=(const char *)cnv->toUBytes;
        cnv->preToUFirstLength=(int8_t)firstLength;
        for(j=0; j<firstLength; ++j) {
            cnv->preToU[j]=*s++;
        }

        /* now copy the newly consumed input */
        s=*src;
        match=-match;
        for(; j<match; ++j) {
            cnv->preToU[j]=*s++;
        }
        *src=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preToULength=(int8_t)match;
        return TRUE;
    } else /* match==0 no match */ {
        return FALSE;
    }
}